

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btMultiBodySolverConstraint>::copy
          (btAlignedObjectArray<btMultiBodySolverConstraint> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  void *in_RAX;
  long in_RCX;
  long lVar1;
  long lVar2;
  
  lVar2 = (long)(int)dst;
  lVar1 = lVar2 * 0xe0;
  for (; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    in_RAX = memcpy((void *)(in_RCX + lVar1),(void *)(*(long *)(this + 0x10) + lVar1),0xe0);
    lVar1 = lVar1 + 0xe0;
  }
  return (int)in_RAX;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}